

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtraction.h
# Opt level: O1

void __thiscall Subtraction_PlusPlus_Test::TestBody(Subtraction_PlusPlus_Test *this)

{
  bool bVar1;
  BigNumber *pBVar2;
  char *pcVar3;
  undefined1 local_a0 [8];
  BigNumber num_1;
  AssertionResult gtest_ar_1;
  AssertHelper local_58;
  AssertionResult gtest_ar;
  
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xffffffffffffffc8
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar.message_,"1234","");
  BigNumber::BigNumber((BigNumber *)local_a0,(string *)&gtest_ar.message_);
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xffffffffffffffc8)
  {
    operator_delete(gtest_ar.message_.ptr_);
  }
  BigNumber::operator--((BigNumber *)&gtest_ar.message_,(BigNumber *)local_a0,0);
  BigNumber::toString_abi_cxx11_((string *)&num_1.m_symbol,(BigNumber *)&gtest_ar.message_);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_58,"\"1234\"","num_1--.toString()",(char (*) [5])"1234",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_1.m_symbol);
  if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)CONCAT71(num_1._33_7_,(undefined1)num_1.m_symbol) != &gtest_ar_1.message_) {
    operator_delete((undefined1 *)CONCAT71(num_1._33_7_,(undefined1)num_1.m_symbol));
  }
  BigNumber::~BigNumber((BigNumber *)&gtest_ar.message_);
  if (local_58.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_1.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x18,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&num_1.m_symbol,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_1.m_symbol);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::toString_abi_cxx11_((string *)&gtest_ar.message_,(BigNumber *)local_a0);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1233\"","num_1.toString()",(char (*) [5])"1233",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xffffffffffffffc8)
  {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x19,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::operator--((BigNumber *)&gtest_ar.message_,(BigNumber *)local_a0,0);
  BigNumber::toString_abi_cxx11_((string *)&num_1.m_symbol,(BigNumber *)&gtest_ar.message_);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_58,"\"1233\"","num_1--.toString()",(char (*) [5])"1233",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_1.m_symbol);
  if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)CONCAT71(num_1._33_7_,(undefined1)num_1.m_symbol) != &gtest_ar_1.message_) {
    operator_delete((undefined1 *)CONCAT71(num_1._33_7_,(undefined1)num_1.m_symbol));
  }
  BigNumber::~BigNumber((BigNumber *)&gtest_ar.message_);
  if (local_58.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_1.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&num_1.m_symbol,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_1.m_symbol);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pBVar2 = BigNumber::operator--((BigNumber *)local_a0);
  BigNumber::toString_abi_cxx11_((string *)&gtest_ar.message_,pBVar2);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1231\"","(--num_1).toString()",(char (*) [5])"1231",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xffffffffffffffc8)
  {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pBVar2 = BigNumber::operator--((BigNumber *)local_a0);
  BigNumber::toString_abi_cxx11_((string *)&gtest_ar.message_,pBVar2);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1230\"","(--num_1).toString()",(char (*) [5])"1230",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xffffffffffffffc8)
  {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::toString_abi_cxx11_((string *)&gtest_ar.message_,(BigNumber *)local_a0);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1230\"","num_1.toString()",(char (*) [5])"1230",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xffffffffffffffc8)
  {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::~BigNumber((BigNumber *)local_a0);
  return;
}

Assistant:

TEST(Subtraction, PlusPlus)
{
    BigNumber num_1("1234");
    EXPECT_EQ("1234", num_1--.toString());
    EXPECT_EQ("1233", num_1.toString());
    EXPECT_EQ("1233", num_1--.toString());
    EXPECT_EQ("1231", (--num_1).toString());
    EXPECT_EQ("1230", (--num_1).toString());
    EXPECT_EQ("1230", num_1.toString());
}